

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mad.cpp
# Opt level: O2

void duckdb::MedianAbsoluteDeviationOperation<long>::
     Window<duckdb::QuantileState<long,duckdb::QuantileStandardType>,long,long>
               (AggregateInputData *aggr_input_data,WindowPartitionInput *partition,
               const_data_ptr_t g_state,data_ptr_t l_state,SubFrames *frames,Vector *result,
               idx_t ridx)

{
  data_ptr_t pdVar1;
  idx_t iVar2;
  idx_t *index;
  bool bVar3;
  CursorType *data;
  idx_t n;
  FunctionData *pFVar4;
  reference q;
  WindowQuantileState<long> *this;
  type this_00;
  const_reference pvVar5;
  long lVar6;
  double dVar7;
  undefined1 auVar8 [16];
  QuantileIncluded<long> included;
  MAD mad;
  ID indirect;
  MadIndirect mad_indirect;
  Interpolator<false> interp;
  long local_b0;
  QuantileIncluded<long> local_a8;
  double local_98;
  double dStack_90;
  MadAccessor<long,_long,_long> local_80;
  QuantileIndirect<long> local_78;
  QuantileComposed<duckdb::MadAccessor<long,_long,_long>,_duckdb::QuantileIndirect<long>_> local_70;
  Interpolator<false> local_60;
  
  data = QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
                   ((QuantileState<long,_duckdb::QuantileStandardType> *)l_state,partition);
  local_a8.fmask = partition->filter_mask;
  pdVar1 = result->data;
  local_a8.dmask = data;
  n = QuantileOperation::FrameSize<long>(&local_a8,frames);
  if (n != 0) {
    pFVar4 = optional_ptr<duckdb::FunctionData,_true>::operator->(&aggr_input_data->bind_data);
    q = vector<duckdb::QuantileValue,_true>::get<true>
                  ((vector<duckdb::QuantileValue,_true> *)(pFVar4 + 1),0);
    this = QuantileState<long,_duckdb::QuantileStandardType>::GetOrCreateWindowState
                     ((QuantileState<long,_duckdb::QuantileStandardType> *)l_state);
    if ((g_state == (const_data_ptr_t)0x0) ||
       (bVar3 = QuantileState<long,_duckdb::QuantileStandardType>::HasTree
                          ((QuantileState<long,_duckdb::QuantileStandardType> *)g_state), !bVar3)) {
      WindowQuantileState<long>::UpdateSkip(this,data,frames,&local_a8);
      this_00 = this;
    }
    else {
      this_00 = unique_ptr<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>,_true>
                ::operator*((unique_ptr<duckdb::WindowQuantileState<long>,_std::default_delete<duckdb::WindowQuantileState<long>_>,_true>
                             *)(g_state + 0x18));
    }
    local_b0 = WindowQuantileState<long>::WindowScalar<long,false>(this_00,data,frames,n,result,q);
    pvVar5 = vector<duckdb::FrameBounds,_true>::back(frames);
    iVar2 = pvVar5->end;
    pvVar5 = vector<duckdb::FrameBounds,_true>::front(frames);
    WindowQuantileState<long>::SetCount(this,iVar2 - pvVar5->start);
    index = (this->m).super_vector<unsigned_long,_std::allocator<unsigned_long>_>.
            super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl.
            super__Vector_impl_data._M_start;
    ReuseIndexes(index,frames,&this->prevs);
    ::std::__partition<unsigned_long*,duckdb::QuantileIncluded<long>>
              (index,index + this->count,local_a8.fmask,local_a8.dmask);
    local_60.desc = false;
    lVar6 = n - 1;
    auVar8._8_4_ = (int)((ulong)lVar6 >> 0x20);
    auVar8._0_8_ = lVar6;
    auVar8._12_4_ = 0x45300000;
    dStack_90 = auVar8._8_8_ - 1.9342813113834067e+25;
    local_98 = (dStack_90 + ((double)CONCAT44(0x43300000,(int)lVar6) - 4503599627370496.0)) * q->dbl
    ;
    local_60.RN = local_98;
    dVar7 = floor(local_98);
    local_60.FRN = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    dVar7 = ceil(local_98);
    local_60.CRN = (long)(dVar7 - 9.223372036854776e+18) & (long)dVar7 >> 0x3f | (long)dVar7;
    local_60.begin = 0;
    local_70.inner = &local_78;
    local_70.outer = &local_80;
    local_80.median = &local_b0;
    local_78.data = data;
    local_60.end = n;
    lVar6 = Interpolator<false>::
            Operation<unsigned_long,long,duckdb::QuantileComposed<duckdb::MadAccessor<long,long,long>,duckdb::QuantileIndirect<long>>>
                      (&local_60,index,result,&local_70);
    *(long *)(pdVar1 + ridx * 8) = lVar6;
    ::std::vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>::operator=
              (&(this->prevs).
                super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>,
               &frames->super_vector<duckdb::FrameBounds,_std::allocator<duckdb::FrameBounds>_>);
    return;
  }
  FlatVector::VerifyFlatVector(result);
  TemplatedValidityMask<unsigned_long>::SetInvalid
            (&(result->validity).super_TemplatedValidityMask<unsigned_long>,ridx);
  return;
}

Assistant:

static void Window(AggregateInputData &aggr_input_data, const WindowPartitionInput &partition,
	                   const_data_ptr_t g_state, data_ptr_t l_state, const SubFrames &frames, Vector &result,
	                   idx_t ridx) {
		auto &state = *reinterpret_cast<STATE *>(l_state);
		auto gstate = reinterpret_cast<const STATE *>(g_state);

		auto &data = state.GetOrCreateWindowCursor(partition);
		const auto &fmask = partition.filter_mask;

		auto rdata = FlatVector::GetData<RESULT_TYPE>(result);

		QuantileIncluded<INPUT_TYPE> included(fmask, data);
		const auto n = FrameSize(included, frames);

		if (!n) {
			auto &rmask = FlatVector::Validity(result);
			rmask.Set(ridx, false);
			return;
		}

		//	Compute the median
		D_ASSERT(aggr_input_data.bind_data);
		auto &bind_data = aggr_input_data.bind_data->Cast<QuantileBindData>();

		D_ASSERT(bind_data.quantiles.size() == 1);
		const auto &quantile = bind_data.quantiles[0];
		auto &window_state = state.GetOrCreateWindowState();
		MEDIAN_TYPE med;
		if (gstate && gstate->HasTree()) {
			med = gstate->GetWindowState().template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		} else {
			window_state.UpdateSkip(data, frames, included);
			med = window_state.template WindowScalar<MEDIAN_TYPE, false>(data, frames, n, result, quantile);
		}

		//  Lazily initialise frame state
		window_state.SetCount(frames.back().end - frames.front().start);
		auto index2 = window_state.m.data();
		D_ASSERT(index2);

		// The replacement trick does not work on the second index because if
		// the median has changed, the previous order is not correct.
		// It is probably close, however, and so reuse is helpful.
		auto &prevs = window_state.prevs;
		ReuseIndexes(index2, frames, prevs);
		std::partition(index2, index2 + window_state.count, included);

		Interpolator<false> interp(quantile, n, false);

		// Compute mad from the second index
		using ID = QuantileIndirect<INPUT_TYPE>;
		ID indirect(data);

		using MAD = MadAccessor<INPUT_TYPE, RESULT_TYPE, MEDIAN_TYPE>;
		MAD mad(med);

		using MadIndirect = QuantileComposed<MAD, ID>;
		MadIndirect mad_indirect(mad, indirect);
		rdata[ridx] = interp.template Operation<idx_t, RESULT_TYPE, MadIndirect>(index2, result, mad_indirect);

		//	Prev is used by both skip lists and increments
		prevs = frames;
	}